

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetMunitionEntityID(LE_Detonation_PDU *this,LE_EntityIdentifier *ID)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  LE_EntityIdentifier *ID_local;
  LE_Detonation_PDU *this_local;
  
  SetMunitionEntityIDFlag(this,true);
  DATA_TYPE::LE_EntityIdentifier::operator=(&this->m_MunitionID,ID);
  KVar1 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&(this->super_LE_Header).m_EntID);
  KVar2 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(ID);
  if (KVar1 == KVar2) {
    KVar1 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&(this->super_LE_Header).m_EntID);
    KVar2 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(ID);
    if (KVar1 == KVar2) {
      SetMunitionEntityIDSiteAppIncludedFlag(this,false);
      return;
    }
  }
  SetMunitionEntityIDSiteAppIncludedFlag(this,true);
  return;
}

Assistant:

void LE_Detonation_PDU::SetMunitionEntityID( const LE_EntityIdentifier & ID )
{
    SetMunitionEntityIDFlag( true );
    m_MunitionID = ID;

    // Check if the firing entity's site and application values
    // are the same, if they are we don't include them.
    if( m_EntID.GetSiteID() == ID.GetSiteID() &&
            m_EntID.GetApplicationID() == ID.GetApplicationID() )
    {
        // They match so don't include the fields
        SetMunitionEntityIDSiteAppIncludedFlag( false );
    }
    else
    {
        // They don't match so we need to send these fields.
        SetMunitionEntityIDSiteAppIncludedFlag( true );
    }
}